

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

void CVmRun::create_loadctx_obj
               (vm_val_t *result,vm_obj_id_t self,vm_obj_id_t defobj,vm_obj_id_t targobj,
               vm_prop_id_t targprop)

{
  vm_obj_id_t vVar1;
  char buf [22];
  char local_28 [3];
  vm_obj_id_t local_25;
  undefined1 local_21;
  vm_prop_id_t local_20;
  undefined1 local_1c;
  vm_obj_id_t local_1b;
  undefined1 local_17;
  vm_obj_id_t local_16;
  
  local_28[0] = '\x04';
  local_28[1] = '\0';
  local_28[2] = 5;
  local_21 = 6;
  local_1c = 5;
  local_17 = 5;
  local_25 = self;
  local_20 = targprop;
  local_1b = targobj;
  local_16 = defobj;
  vVar1 = CVmObjList::create(0,local_28);
  result->typ = VM_OBJ;
  (result->val).obj = vVar1;
  return;
}

Assistant:

void CVmRun::create_loadctx_obj(VMG_ vm_val_t *result,
                                vm_obj_id_t self,
                                vm_obj_id_t defobj,
                                vm_obj_id_t targobj,
                                vm_prop_id_t targprop)
{
    char buf[VMB_LEN + 4*VMB_DATAHOLDER];
    
    /* initialize a list template for a four-element list */
    vmb_put_len(buf, 4);
    
    /* 
     *   put the list elements: 'self', targetprop, original target object,
     *   and defining object 
     */
    vmb_put_dh_obj(buf + VMB_LEN, self);
    vmb_put_dh_prop(buf + VMB_LEN + VMB_DATAHOLDER, targprop);
    vmb_put_dh_obj(buf + VMB_LEN + 2*VMB_DATAHOLDER, targobj);
    vmb_put_dh_obj(buf + VMB_LEN + 3*VMB_DATAHOLDER, defobj);
    
    /* create and return a new list copied from our prepared buffer */
    result->set_obj(CVmObjList::create(vmg_ FALSE, buf));
}